

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int uv_timer_stop(uv_timer_t *handle)

{
  void **ppvVar1;
  uint *puVar2;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uint uVar3;
  uv_loop_t *puVar4;
  heap_node *hb;
  heap_node *phVar5;
  long *plVar6;
  heap_node *phVar7;
  anon_struct_16_2_d918446b_for_timer_heap *paVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  if ((handle->flags & 4) != 0) {
    puVar4 = handle->loop;
    uVar3 = (puVar4->timer_heap).nelts;
    if (uVar3 != 0) {
      heap = &puVar4->timer_heap;
      ppvVar1 = handle->heap_node;
      iVar9 = 0;
      uVar10 = 0;
      for (uVar11 = uVar3; paVar8 = heap, 1 < uVar11; uVar11 = uVar11 >> 1) {
        uVar10 = (uVar11 & 1) + uVar10 * 2;
        iVar9 = iVar9 + -1;
      }
      for (; iVar9 != 0; iVar9 = iVar9 + 1) {
        uVar11 = uVar10 * 8;
        uVar10 = uVar10 >> 1;
        paVar8 = (anon_struct_16_2_d918446b_for_timer_heap *)
                 ((ulong)(uVar11 & 8) + (long)paVar8->min);
      }
      (puVar4->timer_heap).nelts = uVar3 - 1;
      hb = (heap_node *)paVar8->min;
      paVar8->min = (void *)0x0;
      if (hb == (heap_node *)ppvVar1) {
        if ((void **)heap->min == ppvVar1) {
          heap->min = (void *)0x0;
        }
      }
      else {
        phVar5 = (heap_node *)handle->heap_node[0];
        hb->left = phVar5;
        phVar7 = (heap_node *)handle->heap_node[1];
        hb->right = phVar7;
        hb->parent = (heap_node *)handle->heap_node[2];
        if (phVar5 != (heap_node *)0x0) {
          phVar5->parent = hb;
          phVar7 = hb->right;
        }
        if (phVar7 != (heap_node *)0x0) {
          phVar7->parent = hb;
        }
        plVar6 = (long *)handle->heap_node[2];
        paVar8 = heap;
        if (plVar6 != (long *)0x0) {
          paVar8 = (anon_struct_16_2_d918446b_for_timer_heap *)
                   (plVar6 + ((void **)*plVar6 != ppvVar1));
        }
        paVar8->min = hb;
        while( true ) {
          phVar5 = hb->left;
          phVar7 = hb;
          if ((phVar5 != (heap_node *)0x0) && (iVar9 = timer_less_than(phVar5,hb), iVar9 != 0)) {
            phVar7 = phVar5;
          }
          phVar5 = hb->right;
          if ((phVar5 != (heap_node *)0x0) && (iVar9 = timer_less_than(phVar5,phVar7), iVar9 != 0))
          {
            phVar7 = phVar5;
          }
          if (phVar7 == hb) break;
          heap_node_swap((heap *)heap,hb,phVar7);
        }
        while ((phVar5 = hb->parent, phVar5 != (heap_node *)0x0 &&
               (iVar9 = timer_less_than(hb,phVar5), iVar9 != 0))) {
          heap_node_swap((heap *)heap,phVar5,hb);
        }
      }
    }
    uVar3 = handle->flags;
    if (((uVar3 & 4) != 0) && (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
      puVar2 = &handle->loop->active_handles;
      *puVar2 = *puVar2 - 1;
    }
  }
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (!uv__is_active(handle))
    return 0;

  heap_remove(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_stop(handle);

  return 0;
}